

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>::
AttachmentPromiseNode
          (AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
           *this,OwnPromiseNode *dependency,
          OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachment)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *dependencyParam;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *other;
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError> *attachment_local;
  OwnPromiseNode *dependency_local;
  AttachmentPromiseNode<kj::OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>_>
  *this_local;
  
  dependencyParam = mv<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>(dependency);
  AttachmentPromiseNodeBase::AttachmentPromiseNodeBase
            (&this->super_AttachmentPromiseNodeBase,dependencyParam);
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_00d98740;
  other = mv<kj::OneOf<kj::Array<unsigned_char>,kj::WebSocket::ProtocolError>>(attachment);
  OneOf<kj::Array<unsigned_char>,_kj::WebSocket::ProtocolError>::OneOf(&this->attachment,other);
  return;
}

Assistant:

AttachmentPromiseNode(OwnPromiseNode&& dependency, Attachment&& attachment)
      : AttachmentPromiseNodeBase(kj::mv(dependency)),
        attachment(kj::mv<Attachment>(attachment)) {}